

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

bool __thiscall MP1Node::joinRepHandler(MP1Node *this,void *env,char *data,int size)

{
  bool bVar1;
  ostream *poVar2;
  char *env_00;
  char *in_R8;
  
  env_00 = "start joinRepHandler...";
  poVar2 = std::operator<<((ostream *)&std::cout,"start joinRepHandler...");
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((5 < size) && (bVar1 = recvMembershipList(this,env_00,data + 6,size + -6,in_R8), bVar1)) {
    this->memberNode->inGroup = true;
    poVar2 = std::operator<<((ostream *)&std::cout,"...end joinRepHandler.");
    std::endl<char,std::char_traits<char>>(poVar2);
    return true;
  }
  return false;
}

Assistant:

bool MP1Node::joinRepHandler(void *env, char *data, int size) {
    cout << "start joinRepHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr))) {
        return false;
    }

    Address replierAddr;
    memcpy(replierAddr.addr, data, sizeof(memberNode->addr.addr));          //extract replier's Address from data
    data += sizeof(memberNode->addr.addr);
    size -= sizeof(memberNode->addr.addr);

    if (!recvMembershipList(env, data, size, "JOINREP")) {
        return false;
    }
    this->memberNode->inGroup = true;

    cout << "...end joinRepHandler." << endl;
    return true;
}